

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_buffer_alloc(nk_buffer *b,nk_buffer_allocation_type type,nk_size size,nk_size align)

{
  bool bVar1;
  nk_uint nVar2;
  void *pvVar3;
  nk_size local_88;
  float local_6c;
  nk_size local_68;
  nk_size capacity;
  void *memory;
  void *unaligned;
  nk_size alignment;
  nk_size nStack_30;
  int full;
  nk_size align_local;
  nk_size size_local;
  nk_buffer *pnStack_18;
  nk_buffer_allocation_type type_local;
  nk_buffer *b_local;
  
  nStack_30 = align;
  align_local = size;
  size_local._4_4_ = type;
  pnStack_18 = b;
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1fcc,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1fcd,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  if ((b == (nk_buffer *)0x0) || (size == 0)) {
    return (void *)0x0;
  }
  b->needed = size + b->needed;
  if (type == NK_BUFFER_FRONT) {
    memory = (void *)((long)(b->memory).ptr + b->allocated);
  }
  else {
    memory = (void *)((long)(b->memory).ptr + (b->size - size));
  }
  capacity = (nk_size)nk_buffer_align(memory,align,(nk_size *)&unaligned,type);
  if (size_local._4_4_ == NK_BUFFER_FRONT) {
    bVar1 = pnStack_18->size < pnStack_18->allocated + align_local + (long)unaligned;
  }
  else {
    if (pnStack_18->size < align_local + (long)unaligned) {
      local_68 = pnStack_18->size;
    }
    else {
      local_68 = align_local + (long)unaligned;
    }
    bVar1 = pnStack_18->size - local_68 <= pnStack_18->allocated;
  }
  alignment._4_4_ = (uint)bVar1;
  if (alignment._4_4_ != 0) {
    if (pnStack_18->type != NK_BUFFER_DYNAMIC) {
      return (void *)0x0;
    }
    if (((pnStack_18->pool).alloc == (nk_plugin_alloc)0x0) ||
       ((pnStack_18->pool).free == (nk_plugin_free)0x0)) {
      __assert_fail("b->pool.alloc && b->pool.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x1fe0,
                    "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                   );
    }
    if (((pnStack_18->type != NK_BUFFER_DYNAMIC) ||
        ((pnStack_18->pool).alloc == (nk_plugin_alloc)0x0)) ||
       ((pnStack_18->pool).free == (nk_plugin_free)0x0)) {
      return (void *)0x0;
    }
    local_6c = (float)(pnStack_18->memory).size;
    local_6c = local_6c * pnStack_18->grow_factor;
    local_88 = (nk_size)local_6c;
    local_88 = local_88 | (long)(local_6c - 9.223372e+18) & (long)local_88 >> 0x3f;
    nVar2 = nk_round_up_pow2((int)pnStack_18->allocated + (int)align_local);
    if (local_88 < nVar2) {
      nVar2 = nk_round_up_pow2((int)pnStack_18->allocated + (int)align_local);
      local_88 = (nk_size)nVar2;
    }
    pvVar3 = nk_buffer_realloc(pnStack_18,local_88,&(pnStack_18->memory).size);
    (pnStack_18->memory).ptr = pvVar3;
    if ((pnStack_18->memory).ptr == (void *)0x0) {
      return (void *)0x0;
    }
    if (size_local._4_4_ == NK_BUFFER_FRONT) {
      memory = (void *)((long)(pnStack_18->memory).ptr + pnStack_18->allocated);
    }
    else {
      memory = (void *)((long)(pnStack_18->memory).ptr + (pnStack_18->size - align_local));
    }
    capacity = (nk_size)nk_buffer_align(memory,nStack_30,(nk_size *)&unaligned,size_local._4_4_);
  }
  if (size_local._4_4_ == NK_BUFFER_FRONT) {
    pnStack_18->allocated = (long)unaligned + pnStack_18->allocated + align_local;
  }
  else {
    pnStack_18->size = pnStack_18->size - (align_local + (long)unaligned);
  }
  pnStack_18->needed = (long)unaligned + pnStack_18->needed;
  pnStack_18->calls = pnStack_18->calls + 1;
  return (void *)capacity;
}

Assistant:

NK_LIB void*
nk_buffer_alloc(struct nk_buffer *b, enum nk_buffer_allocation_type type,
    nk_size size, nk_size align)
{
    int full;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(size);
    if (!b || !size) return 0;
    b->needed += size;

    /* calculate total size with needed alignment + size */
    if (type == NK_BUFFER_FRONT)
        unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
    else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
    memory = nk_buffer_align(unaligned, align, &alignment, type);

    /* check if buffer has enough memory*/
    if (type == NK_BUFFER_FRONT)
        full = ((b->allocated + size + alignment) > b->size);
    else full = ((b->size - NK_MIN(b->size,(size + alignment))) <= b->allocated);

    if (full) {
        nk_size capacity;
        if (b->type != NK_BUFFER_DYNAMIC)
            return 0;
        NK_ASSERT(b->pool.alloc && b->pool.free);
        if (b->type != NK_BUFFER_DYNAMIC || !b->pool.alloc || !b->pool.free)
            return 0;

        /* buffer is full so allocate bigger buffer if dynamic */
        capacity = (nk_size)((float)b->memory.size * b->grow_factor);
        capacity = NK_MAX(capacity, nk_round_up_pow2((nk_uint)(b->allocated + size)));
        b->memory.ptr = nk_buffer_realloc(b, capacity, &b->memory.size);
        if (!b->memory.ptr) return 0;

        /* align newly allocated pointer */
        if (type == NK_BUFFER_FRONT)
            unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
        else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
        memory = nk_buffer_align(unaligned, align, &alignment, type);
    }
    if (type == NK_BUFFER_FRONT)
        b->allocated += size + alignment;
    else b->size -= (size + alignment);
    b->needed += alignment;
    b->calls++;
    return memory;
}